

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::executePrimaryBufferTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)24>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  RefData<vk::Handle<(vk::HandleType)10>_> data_01;
  RefData<vk::Handle<(vk::HandleType)6>_> data_02;
  VkResult VVar2;
  VkDevice device;
  DeviceInterface *vk_00;
  VkQueue pVVar3;
  Handle<(vk::HandleType)10> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Handle<(vk::HandleType)6> *pHVar6;
  allocator<char> local_2e9;
  string local_2e8;
  undefined4 local_2c8;
  allocator<char> local_2c1;
  string local_2c0;
  deUint64 local_2a0;
  int local_294;
  deUint64 dStack_290;
  VkResult result;
  undefined8 uStack_288;
  VkSubmitInfo submitInfo;
  RefData<vk::Handle<(vk::HandleType)6>_> local_220;
  undefined1 local_200 [8];
  Unique<vk::Handle<(vk::HandleType)6>_> fence;
  VkPipelineStageFlags stageMask;
  Move<vk::Handle<(vk::HandleType)10>_> local_1c8;
  RefData<vk::Handle<(vk::HandleType)10>_> local_1a8;
  undefined1 local_188 [8];
  Unique<vk::Handle<(vk::HandleType)10>_> event;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  Move<vk::VkCommandBuffer_s_*> local_140;
  RefData<vk::VkCommandBuffer_s_*> local_120;
  undefined1 local_100 [8];
  Unique<vk::VkCommandBuffer_s_*> primCmdBuf;
  VkCommandBufferAllocateInfo cmdBufParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_b0;
  RefData<vk::Handle<(vk::HandleType)24>_> local_90;
  undefined1 local_70 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  DeviceInterface *vk;
  VkDevice vkDevice;
  Context *context_local;
  
  device = Context::getDevice(context);
  vk_00 = Context::getDeviceInterface(context);
  pVVar3 = Context::getUniversalQueue(context);
  Context::getUniversalQueueFamilyIndex(context);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_ = 0x27;
  ::vk::createCommandPool
            (&local_b0,vk_00,device,
             (VkCommandPoolCreateInfo *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data.deleter.m_deviceIface = local_90.deleter.m_deviceIface;
  data.object.m_internal = local_90.object.m_internal;
  data.deleter.m_device = local_90.deleter.m_device;
  data.deleter.m_allocator = local_90.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_b0);
  primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._0_4_ = 0x28;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_70);
  ::vk::allocateCommandBuffer
            (&local_140,vk_00,device,
             (VkCommandBufferAllocateInfo *)
             &primCmdBuf.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_00.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_00.object = local_120.object;
  data_00.deleter.m_device = local_120.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_120.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_100,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_140);
  event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x2a;
  ::vk::createEvent(&local_1c8,vk_00,device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1a8,(Move *)&local_1c8);
  data_01.deleter.m_deviceIface = local_1a8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1a8.object.m_internal;
  data_01.deleter.m_device = local_1a8.deleter.m_device;
  data_01.deleter.m_allocator = local_1a8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)10>_>::~Move(&local_1c8);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x1d])(vk_00,device,pHVar4->m_internal);
  ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x36f);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x49])
                    (vk_00,*ppVVar5,
                     &event.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.
                      m_allocator);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x372);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pVVar1 = *ppVVar5;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar4->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6a])
            (vk_00,pVVar1,
             fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,0x10000)
  ;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x37a);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores,vk_00,
                    device,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&submitInfo.pSignalSemaphores)
  ;
  data_02.deleter.m_deviceIface = local_220.deleter.m_deviceIface;
  data_02.object.m_internal = local_220.object.m_internal;
  data_02.deleter.m_device = local_220.deleter.m_device;
  data_02.deleter.m_allocator = local_220.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)6>_> *)&submitInfo.pSignalSemaphores);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_288 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_100);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  dStack_290 = pHVar6->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_288,dStack_290);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x38d);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                     ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_200);
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,device,1,pHVar6,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x390);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)10>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)10>_> *)local_188);
  local_2a0 = pHVar4->m_internal;
  local_294 = (*vk_00->_vptr_DeviceInterface[0x1b])(vk_00,device,local_2a0);
  if (local_294 == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"Execute Primary Command Buffer succeeded",&local_2c1);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e8,"Execute Primary Command Buffer FAILED",&local_2e9);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
  }
  local_2c8 = 1;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)6>_> *)local_200);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)10>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)10>_> *)local_188);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_100);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_70);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus executePrimaryBufferTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// Submit the command buffer to the queue
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if buffer has been executed
	VkResult result = vk.getEventStatus(vkDevice,*event);
	if (result == VK_EVENT_SET)
		return tcu::TestStatus::pass("Execute Primary Command Buffer succeeded");

	return tcu::TestStatus::fail("Execute Primary Command Buffer FAILED");
}